

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O2

bool __thiscall
Js::DictionaryPropertyDescriptor<unsigned_short>::SanityCheckFixedBits
          (DictionaryPropertyDescriptor<unsigned_short> *this)

{
  bool bVar1;
  
  bVar1 = true;
  if ((this->flags & (UsedAsFixed|IsFixed)) != None) {
    if ((this->Attributes & 8) == 0) {
      if ((this->Data == 0xffff) && (this->Getter == 0xffff)) {
        bVar1 = this->Setter != 0xffff;
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool SanityCheckFixedBits()
        {
            return
                (!GetIsFixed() && !GetUsedAsFixed()) ||
                (!(this->Attributes & PropertyDeleted) && (this->Data != NoSlots || this->Getter != NoSlots || this->Setter != NoSlots));
        }